

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O1

EStatusCode __thiscall
Type1ToType2Converter::RecordOperatorWithParameters
          (Type1ToType2Converter *this,unsigned_short inMarkerType,LongList *inOperandList)

{
  size_t *psVar1;
  LongList *pLVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _Node *p_Var5;
  _List_node_base **pp_Var6;
  ConversionNode node;
  ConversionNode CStack_48;
  
  pLVar2 = &CStack_48.mOperands;
  CStack_48.mOperands.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
  CStack_48.mOperands.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)pLVar2;
  CStack_48.mOperands.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)pLVar2;
  p_Var5 = std::__cxx11::list<ConversionNode,std::allocator<ConversionNode>>::
           _M_create_node<ConversionNode_const&>
                     ((list<ConversionNode,std::allocator<ConversionNode>> *)
                      &this->mConversionProgram,&CStack_48);
  std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
  psVar1 = &(this->mConversionProgram).
            super__List_base<ConversionNode,_std::allocator<ConversionNode>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  p_Var3 = (this->mConversionProgram).
           super__List_base<ConversionNode,_std::allocator<ConversionNode>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  *(unsigned_short *)&p_Var3[1]._M_next = inMarkerType;
  pp_Var6 = &p_Var3[1]._M_prev;
  p_Var3 = CStack_48.mOperands.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if ((LongList *)pp_Var6 != inOperandList) {
    std::__cxx11::list<long,std::allocator<long>>::
    _M_assign_dispatch<std::_List_const_iterator<long>>
              ((list<long,std::allocator<long>> *)pp_Var6,
               (inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node.
               super__List_node_base._M_next,inOperandList);
    p_Var3 = CStack_48.mOperands.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
             super__List_node_base._M_next;
  }
  while (p_Var3 != (_List_node_base *)pLVar2) {
    p_Var4 = (((_List_base<long,_std::allocator<long>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var4;
  }
  return eSuccess;
}

Assistant:

EStatusCode Type1ToType2Converter::RecordOperatorWithParameters(unsigned short inMarkerType,const LongList& inOperandList)
{
	ConversionNode node;
	mConversionProgram.push_back(node);
	mConversionProgram.back().mMarkerType = inMarkerType;
	mConversionProgram.back().mOperands = inOperandList;
	return eSuccess;
}